

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O0

void __thiscall Assimp::PlyExporter::~PlyExporter(PlyExporter *this)

{
  PlyExporter *this_local;
  
  std::__cxx11::string::~string((string *)&this->endl);
  std::__cxx11::string::~string((string *)&this->filename);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

PlyExporter::~PlyExporter() {
    // empty
}